

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O2

bool __thiscall chaiscript::parser::ChaiScript_Parser::Class_Statements(ChaiScript_Parser *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  bVar3 = true;
  bVar1 = false;
  while (bVar4 = bVar1, bVar3 != false) {
    bVar2 = Def(this,true);
    bVar3 = true;
    bVar1 = true;
    if (!bVar2) {
      bVar2 = Var_Decl(this,true);
      bVar1 = true;
      if (!bVar2) {
        bVar3 = Eol(this);
        bVar1 = (bool)(bVar4 | bVar3);
      }
    }
  }
  return bVar4;
}

Assistant:

bool Class_Statements() {
        bool retval = false;

        bool has_more = true;
        bool saw_eol = true;

        while (has_more) {
          const auto start = m_position;
          if (Def(true) || Var_Decl(true)) {
            if (!saw_eol) {
              throw exception::eval_error("Two function definitions missing line separator", File_Position(start.line, start.col), *m_filename);
            }
            has_more = true;
            retval = true;
            saw_eol = true;
          } else if (Eol()) {
            has_more = true;
            retval = true;
            saw_eol = true;
          } else {
            has_more = false;
          }
        }

        return retval;
      }